

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O2

void __thiscall Rml::ElementEffects::RenderEffects(ElementEffects *this,RenderStage render_stage)

{
  pointer pDVar1;
  pointer pDVar2;
  pointer pFVar3;
  element_type *peVar4;
  long *plVar5;
  RenderManager *pRVar6;
  LayerHandle LVar7;
  LayerHandle LVar8;
  LayerHandle destination;
  FilterEntry *filter;
  ulong uVar9;
  long lVar10;
  pointer pFVar11;
  Rectanglei new_region;
  Rectangle<int> new_region_00;
  RenderManager *render_manager;
  FilterHandleList filter_handles;
  CompiledFilter mask_image_filter;
  anon_class_16_2_3014caff ApplyClippingRegion;
  Span<const_unsigned_long> local_60;
  Span<const_unsigned_long> local_50;
  
  InstanceEffects(this);
  ReloadEffectsData(this);
  pDVar1 = (this->decorators).
           super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->decorators).
           super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (render_stage == Decoration && pDVar1 != pDVar2) {
    uVar9 = (long)pDVar2 - (long)pDVar1;
    lVar10 = (uVar9 & 0x1fffffffe0) - 0x10;
    for (uVar9 = uVar9 >> 5; 0 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
      pDVar1 = (this->decorators).
               super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pDVar1->decorator).
                           super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + lVar10) != 0) {
        plVar5 = *(long **)((long)pDVar1 + lVar10 + -0x10);
        (**(code **)(*plVar5 + 0x20))(plVar5,this->element);
      }
      lVar10 = lVar10 + -0x20;
    }
  }
  if ((((this->filters).
        super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->filters).
        super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) ||
      ((this->backdrop_filters).
       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->backdrop_filters).
       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish)) ||
     ((this->mask_images).
      super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mask_images).
      super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pRVar6 = Element::GetRenderManager(this->element);
    if (pRVar6 != (RenderManager *)0x0) {
      render_manager = pRVar6;
      new_region = RenderManager::GetScissorRegion(pRVar6);
      ApplyClippingRegion.render_manager = &render_manager;
      ApplyClippingRegion.this = this;
      if (render_stage == Exit) {
        if (((this->filters).
             super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->filters).
             super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           ((this->mask_images).
            super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->mask_images).
            super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          RenderEffects::anon_class_16_2_3014caff::operator()(&ApplyClippingRegion,Filter);
          filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          mask_image_filter.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.
          render_manager = (RenderManager *)0x0;
          mask_image_filter.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.
          resource_handle = 0;
          filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    (&filter_handles,
                     (ulong)((this->mask_images).
                             super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start !=
                            (this->mask_images).
                            super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish) +
                     ((long)(this->filters).
                            super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->filters).
                            super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          pFVar3 = (this->filters).
                   super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pFVar11 = (this->filters).
                         super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start; pFVar11 != pFVar3;
              pFVar11 = pFVar11 + 1) {
            CompiledFilter::AddHandleTo(&pFVar11->compiled,&filter_handles);
          }
          if ((this->mask_images).
              super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->mask_images).
              super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            RenderManager::PushLayer(render_manager);
            uVar9 = (long)(this->mask_images).
                          super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mask_images).
                          super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            lVar10 = (uVar9 & 0x1fffffffe0) - 0x10;
            for (uVar9 = uVar9 >> 5; 0 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
              pDVar1 = (this->mask_images).
                       super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (*(long *)((long)&(pDVar1->decorator).
                                   super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar10) != 0) {
                plVar5 = *(long **)((long)pDVar1 + lVar10 + -0x10);
                (**(code **)(*plVar5 + 0x20))(plVar5,this->element);
              }
              lVar10 = lVar10 + -0x20;
            }
            RenderManager::SaveLayerAsMaskImage((RenderManager *)&stack0xffffffffffffffc0);
            UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>::operator=
                      (&mask_image_filter.
                        super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>,
                       (UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL> *)
                       &stack0xffffffffffffffc0);
            UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>::~UniqueRenderResource
                      ((UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL> *)
                       &stack0xffffffffffffffc0);
            CompiledFilter::AddHandleTo
                      ((CompiledFilter *)
                       &mask_image_filter.
                        super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>,
                       &filter_handles);
            RenderManager::PopLayer(render_manager);
          }
          pRVar6 = render_manager;
          LVar7 = RenderManager::GetTopLayer(render_manager);
          LVar8 = RenderManager::GetNextLayer(render_manager);
          Span<const_unsigned_long>::Span(&local_60,&filter_handles);
          RenderManager::CompositeLayers(pRVar6,LVar7,LVar8,Blend,local_60);
          RenderManager::PopLayer(render_manager);
          RenderManager::SetScissorRegion(render_manager,new_region);
          ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&filter_handles.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>::~UniqueRenderResource
                    (&mask_image_filter.
                      super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>);
        }
      }
      else if (render_stage == Enter) {
        LVar7 = RenderManager::GetTopLayer(pRVar6);
        if (((this->filters).
             super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->filters).
             super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           ((this->mask_images).
            super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->mask_images).
            super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          RenderManager::PushLayer(render_manager);
        }
        if ((this->backdrop_filters).
            super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->backdrop_filters).
            super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          LVar8 = RenderManager::GetTopLayer(render_manager);
          filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0xbf800000bf800000;
          ElementUtilities::GetBoundingBox((Rectanglef *)&filter_handles,this->element,Border);
          pFVar3 = (this->backdrop_filters).
                   super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pFVar11 = (this->backdrop_filters).
                         super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start; pFVar11 != pFVar3;
              pFVar11 = pFVar11 + 1) {
            peVar4 = (pFVar11->filter).
                     super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (*peVar4->_vptr_Filter[3])(peVar4,this->element,(Rectanglef *)&filter_handles);
          }
          Math::ExpandToPixelGrid((Rectanglef *)&filter_handles);
          pRVar6 = render_manager;
          new_region_00 = Rectangle::operator_cast_to_Rectangle((Rectanglef *)&filter_handles);
          RenderManager::SetScissorRegion(pRVar6,new_region_00);
          RenderManager::PushLayer(render_manager);
          destination = RenderManager::GetTopLayer(render_manager);
          filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pFVar3 = (this->backdrop_filters).
                   super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pFVar11 = (this->backdrop_filters).
                         super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start; pRVar6 = render_manager,
              pFVar11 != pFVar3; pFVar11 = pFVar11 + 1) {
            CompiledFilter::AddHandleTo(&pFVar11->compiled,&filter_handles);
          }
          Span<const_unsigned_long>::Span(&local_50,&filter_handles);
          RenderManager::CompositeLayers(pRVar6,LVar7,destination,Blend,local_50);
          RenderEffects::anon_class_16_2_3014caff::operator()(&ApplyClippingRegion,BackdropFilter);
          RenderManager::CompositeLayers
                    (render_manager,destination,LVar8,Blend,(Span<const_unsigned_long>)ZEXT816(0));
          RenderManager::PopLayer(render_manager);
          RenderManager::SetScissorRegion(render_manager,new_region);
          ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&filter_handles.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        }
      }
    }
  }
  return;
}

Assistant:

void ElementEffects::RenderEffects(RenderStage render_stage)
{
	InstanceEffects();
	ReloadEffectsData();

	if (!decorators.empty())
	{
		if (render_stage == RenderStage::Decoration)
		{
			// Render the decorators attached to this element in its current state.
			// Render from back to front for correct render order.
			for (int i = (int)decorators.size() - 1; i >= 0; i--)
			{
				DecoratorEntry& decorator = decorators[i];
				if (decorator.decorator_data)
					decorator.decorator->RenderElement(element, decorator.decorator_data);
			}
		}
	}

	if (filters.empty() && backdrop_filters.empty() && mask_images.empty())
		return;

	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return;

	Rectanglei initial_scissor_region = render_manager->GetScissorRegion();

	auto ApplyClippingRegion = [this, &render_manager](PropertyId filter_id) {
		RMLUI_ASSERT(filter_id == PropertyId::Filter || filter_id == PropertyId::BackdropFilter);

		const bool force_clip_to_self_border_box = (filter_id == PropertyId::BackdropFilter);
		ElementUtilities::SetClippingRegion(element, force_clip_to_self_border_box);

		// Find the region being affected by the active filters and apply it as a scissor.
		Rectanglef filter_region = Rectanglef::MakeInvalid();
		ElementUtilities::GetBoundingBox(filter_region, element, force_clip_to_self_border_box ? BoxArea::Border : BoxArea::Auto);

		// The filter property may draw outside our normal clipping region due to ink overflow.
		if (filter_id == PropertyId::Filter)
		{
			for (const auto& filter : filters)
				filter.filter->ExtendInkOverflow(element, filter_region);
		}

		Math::ExpandToPixelGrid(filter_region);

		Rectanglei scissor_region = Rectanglei(filter_region).IntersectIfValid(render_manager->GetScissorRegion());
		render_manager->SetScissorRegion(scissor_region);
	};
	auto ApplyScissorRegionForBackdrop = [this, &render_manager]() {
		// Set the scissor region for backdrop drawing, which covers the element's border box plus any area we may need
		// to read from, such as any blur radius.
		Rectanglef filter_region = Rectanglef::MakeInvalid();
		ElementUtilities::GetBoundingBox(filter_region, element, BoxArea::Border);
		for (const auto& filter : backdrop_filters)
			filter.filter->ExtendInkOverflow(element, filter_region);
		Math::ExpandToPixelGrid(filter_region);
		render_manager->SetScissorRegion(Rectanglei(filter_region));
	};

	if (render_stage == RenderStage::Enter)
	{
		const LayerHandle backdrop_source_layer = render_manager->GetTopLayer();

		if (!filters.empty() || !mask_images.empty())
		{
			render_manager->PushLayer();
		}

		if (!backdrop_filters.empty())
		{
			const LayerHandle backdrop_destination_layer = render_manager->GetTopLayer();

			// @performance We strictly only need this temporary buffer when having to read from outside the element
			// boundaries, which currently only applies to blur and drop-shadow. Alternatively, we could avoid this
			// completely if we introduced a render interface API concept of different input and output clipping. That
			// is, we set a large input scissor to cover all input data, which can be used e.g. during blurring, and use
			// our small border-area-only clipping region for the composite layers output.
			ApplyScissorRegionForBackdrop();
			render_manager->PushLayer();
			const LayerHandle backdrop_temp_layer = render_manager->GetTopLayer();

			FilterHandleList filter_handles;
			for (auto& filter : backdrop_filters)
				filter.compiled.AddHandleTo(filter_handles);

			// Render the backdrop filters in the extended scissor region including any ink overflow.
			render_manager->CompositeLayers(backdrop_source_layer, backdrop_temp_layer, BlendMode::Blend, filter_handles);

			// Then composite the filter output to our destination while applying our clipping region, including any border-radius.
			ApplyClippingRegion(PropertyId::BackdropFilter);
			render_manager->CompositeLayers(backdrop_temp_layer, backdrop_destination_layer, BlendMode::Blend, {});
			render_manager->PopLayer();
			render_manager->SetScissorRegion(initial_scissor_region);
		}
	}
	else if (render_stage == RenderStage::Exit)
	{
		if (!filters.empty() || !mask_images.empty())
		{
			ApplyClippingRegion(PropertyId::Filter);

			CompiledFilter mask_image_filter;
			FilterHandleList filter_handles;
			filter_handles.reserve(filters.size() + (mask_images.empty() ? 0 : 1));

			for (auto& filter : filters)
				filter.compiled.AddHandleTo(filter_handles);

			if (!mask_images.empty())
			{
				render_manager->PushLayer();

				for (int i = (int)mask_images.size() - 1; i >= 0; i--)
				{
					DecoratorEntry& mask_image = mask_images[i];
					if (mask_image.decorator_data)
						mask_image.decorator->RenderElement(element, mask_image.decorator_data);
				}
				mask_image_filter = render_manager->SaveLayerAsMaskImage();
				mask_image_filter.AddHandleTo(filter_handles);
				render_manager->PopLayer();
			}

			render_manager->CompositeLayers(render_manager->GetTopLayer(), render_manager->GetNextLayer(), BlendMode::Blend, filter_handles);
			render_manager->PopLayer();
			render_manager->SetScissorRegion(initial_scissor_region);
		}
	}
}